

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  parasail_result_t *ppVar17;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  uint uVar18;
  size_t len;
  ulong uVar19;
  char *pcVar20;
  int16_t iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar25;
  int iVar26;
  char *__format;
  long lVar27;
  undefined2 uVar28;
  long lVar29;
  ulong size;
  bool bVar30;
  short sVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i alVar45;
  short sVar66;
  short sVar74;
  short sVar76;
  short sVar78;
  short sVar80;
  short sVar82;
  short sVar84;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  __m128i alVar70;
  ushort uVar67;
  undefined1 auVar71 [16];
  ushort uVar75;
  ushort uVar77;
  ushort uVar79;
  ushort uVar81;
  ushort uVar83;
  ushort uVar85;
  short sVar86;
  ushort uVar87;
  undefined1 auVar72 [16];
  __m128i alVar73;
  ulong uVar88;
  undefined1 auVar89 [16];
  __m128i alVar90;
  undefined1 auVar91 [16];
  long lVar93;
  __m128i alVar92;
  ushort uVar94;
  ulong uVar95;
  ushort uVar100;
  ushort uVar101;
  ushort uVar103;
  ushort uVar105;
  ushort uVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ushort uVar102;
  ushort uVar107;
  undefined1 auVar98 [16];
  long lVar104;
  __m128i alVar99;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  ushort uVar114;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  undefined1 auVar115 [16];
  ushort uVar123;
  undefined1 auVar116 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  ushort uVar133;
  ushort uVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar141 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  undefined1 local_1e8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  ushort local_128;
  ushort uStack_126;
  ushort local_a8;
  ushort uStack_a6;
  __m128i_16_t h;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar20 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar20 = "profile->matrix";
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar20 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "open";
        }
        else {
          if (-1 < gap) {
            local_1b8._0_4_ = gap;
            uVar25 = uVar18 - 1;
            size = (ulong)uVar18 + 7 >> 3;
            uVar37 = (ulong)uVar25 % size;
            pvVar5 = (profile->profile16).matches;
            pvVar6 = (profile->profile16).similar;
            iVar22 = -open;
            iVar24 = ppVar4->min;
            iVar26 = -iVar24;
            if (iVar24 != iVar22 && SBORROW4(iVar24,iVar22) == iVar24 + open < 0) {
              iVar26 = open;
            }
            iVar13 = ppVar4->max;
            ppVar17 = parasail_result_new_stats();
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag = ppVar17->flag | 0x8210401;
              b = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign___m128i(0x10,size);
              ptr_05 = parasail_memalign___m128i(0x10,size);
              ptr_06 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              auVar108 = (undefined1  [16])0x0;
              auVar38._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar38._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar69._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar69._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar38 = packssdw(auVar38,auVar69);
              auVar68._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar68._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar89._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
              auVar89._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
              auVar68 = packssdw(auVar68,auVar89);
              auVar38 = packssdw(auVar38,auVar68);
              if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                    ptr_05 != (__m128i *)0x0) &&
                   ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                   ptr_02 != (__m128i *)0x0)) && ptr_06 != (int16_t *)0x0) &&
                  ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar38 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar38 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar38 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar38 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar38 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar38 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar38 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar38 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar38 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar38 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar38 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar38 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar38[0xf])) {
                iVar14 = s2Len + -1;
                auVar38 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar35 = auVar38._0_4_;
                len = (size_t)(uint)gap;
                auVar38 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar36 = auVar38._0_4_;
                uVar15 = iVar26 - 0x7fff;
                auVar38 = pshuflw(ZEXT416(uVar15),ZEXT416(uVar15),0);
                local_128 = auVar38._0_2_;
                uStack_126 = auVar38._2_2_;
                auVar68 = ZEXT416(CONCAT22((short)((uint)iVar24 >> 0x10),0x7ffe - (short)iVar13));
                auVar68 = pshuflw(auVar68,auVar68,0);
                uVar23 = (uint)size;
                auVar69 = pshufb(ZEXT416(uVar23),_DAT_008a3bd0);
                auVar89 = pshufb(ZEXT416(-(uVar23 * gap)),_DAT_008a3bd0);
                auVar89 = paddsw(auVar89,ZEXT416(uVar15 & 0xffff));
                alVar70[1] = size;
                alVar70[0] = size;
                parasail_memset___m128i(b_03,alVar70,len);
                alVar39[1] = extraout_RDX;
                alVar39[0] = size;
                parasail_memset___m128i(b_04,alVar39,len);
                alVar90[1] = extraout_RDX_00;
                alVar90[0] = size;
                parasail_memset___m128i(b_05,alVar90,len);
                c[1] = extraout_RDX_01;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_02;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_03;
                c_01[0] = size;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_04;
                c_02[0] = size;
                parasail_memset___m128i(b_02,c_02,len);
                auVar72._4_4_ = uVar35;
                auVar72._0_4_ = uVar35;
                auVar72._8_4_ = uVar35;
                auVar72._12_4_ = uVar35;
                alVar90 = (__m128i)psubsw((undefined1  [16])0x0,auVar72);
                uVar16 = uVar23 - 1;
                alVar39 = (__m128i)pmovsxbw(extraout_XMM0,0x101010101010101);
                alVar70 = alVar39;
                for (uVar18 = uVar16; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
                  ptr_04[uVar18] = alVar90;
                  ptr_05[uVar18] = alVar70;
                  auVar110._4_4_ = uVar36;
                  auVar110._0_4_ = uVar36;
                  auVar110._8_4_ = uVar36;
                  auVar110._12_4_ = uVar36;
                  alVar90 = (__m128i)psubsw((undefined1  [16])alVar90,auVar110);
                  alVar70 = (__m128i)paddsw((undefined1  [16])alVar70,(undefined1  [16])alVar39);
                }
                iVar24 = iVar22;
                for (uVar19 = 0; uVar19 != size; uVar19 = uVar19 + 1) {
                  iVar26 = iVar24;
                  for (lVar27 = 0; lVar27 != 8; lVar27 = lVar27 + 1) {
                    uVar28 = 0x8000;
                    if (-0x8000 < iVar26) {
                      uVar28 = (undefined2)iVar26;
                    }
                    *(undefined2 *)((long)&h + lVar27 * 2) = uVar28;
                    iVar26 = iVar26 - uVar23 * gap;
                  }
                  ptr[uVar19][0] = h.m[0];
                  ptr[uVar19][1] = h.m[1];
                  iVar24 = iVar24 - gap;
                }
                *ptr_06 = 0;
                for (uVar19 = 1; s2Len + 1 != uVar19; uVar19 = uVar19 + 1) {
                  iVar21 = -0x8000;
                  if (-0x8000 < iVar22) {
                    iVar21 = (int16_t)iVar22;
                  }
                  ptr_06[uVar19] = iVar21;
                  iVar22 = iVar22 - gap;
                }
                uVar19 = 0;
                local_a8 = auVar68._0_2_;
                uStack_a6 = auVar68._2_2_;
                uVar114 = local_128;
                uVar117 = uStack_126;
                uVar118 = local_128;
                uVar119 = uStack_126;
                uVar120 = local_128;
                uVar121 = uStack_126;
                uVar122 = local_128;
                uVar123 = uStack_126;
                uVar127 = local_a8;
                uVar128 = uStack_a6;
                uVar129 = local_a8;
                uVar130 = uStack_a6;
                uVar131 = local_a8;
                uVar132 = uStack_a6;
                uVar133 = local_a8;
                uVar134 = uStack_a6;
                while (uVar19 != (uint)s2Len) {
                  uVar88 = ptr[uVar16][0];
                  uVar95 = b_03[uVar16][0];
                  uVar7 = b_04[uVar16][0];
                  uVar8 = b_05[uVar16][0];
                  auVar109._0_8_ = uVar95 << 0x10;
                  auVar109._8_8_ = b_03[uVar16][1] << 0x10 | uVar95 >> 0x30;
                  auVar140._0_8_ = uVar7 << 0x10;
                  auVar140._8_8_ = b_04[uVar16][1] << 0x10 | uVar7 >> 0x30;
                  auVar141._0_8_ = uVar8 << 0x10;
                  auVar141._8_8_ = b_05[uVar16][1] << 0x10 | uVar8 >> 0x30;
                  auVar113._8_8_ = ptr[uVar16][1] << 0x10 | uVar88 >> 0x30;
                  auVar113._0_8_ = uVar88 << 0x10 | (ulong)(ushort)ptr_06[uVar19];
                  lVar29 = (long)(int)(ppVar4->mapper[(byte)s2[uVar19]] * uVar23) * 0x10;
                  auVar71._4_2_ = local_128;
                  auVar71._0_4_ = auVar38._0_4_;
                  auVar71._6_2_ = uStack_126;
                  auVar71._8_2_ = local_128;
                  auVar71._10_2_ = uStack_126;
                  auVar71._12_2_ = local_128;
                  auVar71._14_2_ = uStack_126;
                  auVar124 = psubsw(auVar71,(undefined1  [16])*ptr_04);
                  local_188 = ZEXT816(0);
                  lVar27 = 0;
                  local_198 = ZEXT816(0);
                  auVar68 = (undefined1  [16])0x0;
                  local_1e8 = auVar108;
                  local_178 = in_XMM15;
                  while( true ) {
                    sVar34 = auVar71._2_2_;
                    sVar50 = auVar71._4_2_;
                    sVar53 = auVar71._6_2_;
                    sVar56 = auVar71._8_2_;
                    sVar59 = auVar71._10_2_;
                    sVar62 = auVar71._12_2_;
                    sVar65 = auVar71._14_2_;
                    sVar33 = auVar71._0_2_;
                    if (size << 4 == lVar27) break;
                    auVar108 = *(undefined1 (*) [16])((long)*ptr + lVar27);
                    auVar72 = *(undefined1 (*) [16])((long)*b_03 + lVar27);
                    auVar110 = *(undefined1 (*) [16])((long)*b_04 + lVar27);
                    auVar11._4_4_ = uVar35;
                    auVar11._0_4_ = uVar35;
                    auVar11._8_4_ = uVar35;
                    auVar11._12_4_ = uVar35;
                    auVar112 = psubsw(auVar108,auVar11);
                    auVar9._4_4_ = uVar36;
                    auVar9._0_4_ = uVar36;
                    auVar9._8_4_ = uVar36;
                    auVar9._12_4_ = uVar36;
                    auVar71 = psubsw(*(undefined1 (*) [16])((long)*b + lVar27),auVar9);
                    sVar31 = auVar112._0_2_;
                    sVar66 = auVar71._0_2_;
                    auVar40._0_2_ = -(ushort)(sVar66 < sVar31);
                    sVar46 = auVar112._2_2_;
                    sVar74 = auVar71._2_2_;
                    auVar40._2_2_ = -(ushort)(sVar74 < sVar46);
                    sVar48 = auVar112._4_2_;
                    sVar76 = auVar71._4_2_;
                    auVar40._4_2_ = -(ushort)(sVar76 < sVar48);
                    sVar51 = auVar112._6_2_;
                    sVar78 = auVar71._6_2_;
                    auVar40._6_2_ = -(ushort)(sVar78 < sVar51);
                    sVar54 = auVar112._8_2_;
                    sVar80 = auVar71._8_2_;
                    auVar40._8_2_ = -(ushort)(sVar80 < sVar54);
                    sVar57 = auVar112._10_2_;
                    sVar82 = auVar71._10_2_;
                    auVar40._10_2_ = -(ushort)(sVar82 < sVar57);
                    sVar60 = auVar112._12_2_;
                    sVar84 = auVar71._12_2_;
                    sVar63 = auVar112._14_2_;
                    auVar40._12_2_ = -(ushort)(sVar84 < sVar60);
                    sVar86 = auVar71._14_2_;
                    auVar40._14_2_ = -(ushort)(sVar86 < sVar63);
                    auVar96 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar27),auVar72,auVar40)
                    ;
                    auVar135 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar27),auVar110,
                                        auVar40);
                    auVar112 = *(undefined1 (*) [16])((long)*b_05 + lVar27);
                    auVar71 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar27),auVar112,auVar40
                                      );
                    auVar124 = paddsw(auVar124,*(undefined1 (*) [16])((long)*ptr_04 + lVar27));
                    sVar32 = auVar124._0_2_;
                    auVar41._0_2_ = -(ushort)(sVar33 < sVar32);
                    sVar47 = auVar124._2_2_;
                    auVar41._2_2_ = -(ushort)(sVar34 < sVar47);
                    sVar49 = auVar124._4_2_;
                    auVar41._4_2_ = -(ushort)(sVar50 < sVar49);
                    sVar52 = auVar124._6_2_;
                    auVar41._6_2_ = -(ushort)(sVar53 < sVar52);
                    sVar55 = auVar124._8_2_;
                    auVar41._8_2_ = -(ushort)(sVar56 < sVar55);
                    sVar58 = auVar124._10_2_;
                    auVar41._10_2_ = -(ushort)(sVar59 < sVar58);
                    sVar61 = auVar124._12_2_;
                    sVar64 = auVar124._14_2_;
                    auVar41._12_2_ = -(ushort)(sVar62 < sVar61);
                    auVar41._14_2_ = -(ushort)(sVar65 < sVar64);
                    local_188 = pblendvb(local_188,local_1b8,auVar41);
                    local_198 = pblendvb(local_198,local_1e8,auVar41);
                    uVar67 = (ushort)(sVar66 < sVar31) * sVar31 |
                             (ushort)(sVar66 >= sVar31) * sVar66;
                    uVar75 = (ushort)(sVar74 < sVar46) * sVar46 |
                             (ushort)(sVar74 >= sVar46) * sVar74;
                    uVar77 = (ushort)(sVar76 < sVar48) * sVar48 |
                             (ushort)(sVar76 >= sVar48) * sVar76;
                    uVar79 = (ushort)(sVar78 < sVar51) * sVar51 |
                             (ushort)(sVar78 >= sVar51) * sVar78;
                    uVar81 = (ushort)(sVar80 < sVar54) * sVar54 |
                             (ushort)(sVar80 >= sVar54) * sVar80;
                    uVar83 = (ushort)(sVar82 < sVar57) * sVar57 |
                             (ushort)(sVar82 >= sVar57) * sVar82;
                    uVar85 = (ushort)(sVar84 < sVar60) * sVar60 |
                             (ushort)(sVar84 >= sVar60) * sVar84;
                    uVar87 = (ushort)(sVar86 < sVar63) * sVar63 |
                             (ushort)(sVar86 >= sVar63) * sVar86;
                    auVar124 = paddsw(local_178,*(undefined1 (*) [16])((long)*ptr_05 + lVar27));
                    auVar68 = pblendvb(auVar68,auVar124,auVar41);
                    auVar138 = paddsw(auVar113,*(undefined1 (*) [16])
                                                ((long)pvVar3 + lVar27 + lVar29));
                    auVar115 = paddsw(auVar109,*(undefined1 (*) [16])
                                                ((long)pvVar5 + lVar27 + lVar29));
                    auVar140 = paddsw(auVar140,*(undefined1 (*) [16])
                                                ((long)pvVar6 + lVar27 + lVar29));
                    sVar31 = auVar138._0_2_;
                    auVar42._0_2_ = -(ushort)(sVar31 < (short)uVar67);
                    sVar46 = auVar138._2_2_;
                    auVar42._2_2_ = -(ushort)(sVar46 < (short)uVar75);
                    sVar48 = auVar138._4_2_;
                    auVar42._4_2_ = -(ushort)(sVar48 < (short)uVar77);
                    sVar51 = auVar138._6_2_;
                    auVar42._6_2_ = -(ushort)(sVar51 < (short)uVar79);
                    sVar54 = auVar138._8_2_;
                    auVar42._8_2_ = -(ushort)(sVar54 < (short)uVar81);
                    sVar57 = auVar138._10_2_;
                    auVar42._10_2_ = -(ushort)(sVar57 < (short)uVar83);
                    sVar60 = auVar138._12_2_;
                    auVar42._12_2_ = -(ushort)(sVar60 < (short)uVar85);
                    sVar63 = auVar138._14_2_;
                    auVar42._14_2_ = -(ushort)(sVar63 < (short)uVar87);
                    local_1b8 = pblendvb(auVar115,auVar96,auVar42);
                    local_1e8 = pblendvb(auVar140,auVar135,auVar42);
                    auVar113 = pmovsxbw(local_1e8,0x101010101010101);
                    auVar109 = paddsw(auVar71,auVar113);
                    auVar113 = paddsw(auVar141,auVar113);
                    local_178 = pblendvb(auVar113,auVar109,auVar42);
                    auVar71._0_2_ =
                         (ushort)(sVar33 < sVar32) * sVar32 | (ushort)(sVar33 >= sVar32) * sVar33;
                    auVar71._2_2_ =
                         (ushort)(sVar34 < sVar47) * sVar47 | (ushort)(sVar34 >= sVar47) * sVar34;
                    auVar71._4_2_ =
                         (ushort)(sVar50 < sVar49) * sVar49 | (ushort)(sVar50 >= sVar49) * sVar50;
                    auVar71._6_2_ =
                         (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
                    auVar71._8_2_ =
                         (ushort)(sVar56 < sVar55) * sVar55 | (ushort)(sVar56 >= sVar55) * sVar56;
                    auVar71._10_2_ =
                         (ushort)(sVar59 < sVar58) * sVar58 | (ushort)(sVar59 >= sVar58) * sVar59;
                    auVar71._12_2_ =
                         (ushort)(sVar62 < sVar61) * sVar61 | (ushort)(sVar62 >= sVar61) * sVar62;
                    auVar71._14_2_ =
                         (ushort)(sVar65 < sVar64) * sVar64 | (ushort)(sVar65 >= sVar64) * sVar65;
                    puVar1 = (ushort *)((long)*b + lVar27);
                    *puVar1 = uVar67;
                    puVar1[1] = uVar75;
                    puVar1[2] = uVar77;
                    puVar1[3] = uVar79;
                    puVar1[4] = uVar81;
                    puVar1[5] = uVar83;
                    puVar1[6] = uVar85;
                    puVar1[7] = uVar87;
                    *(undefined1 (*) [16])((long)*b_00 + lVar27) = auVar96;
                    *(undefined1 (*) [16])((long)*b_01 + lVar27) = auVar135;
                    *(undefined1 (*) [16])((long)*b_02 + lVar27) = auVar109;
                    auVar124._0_2_ =
                         (ushort)((short)uVar67 < sVar31) * sVar31 |
                         ((short)uVar67 >= sVar31) * uVar67;
                    auVar124._2_2_ =
                         (ushort)((short)uVar75 < sVar46) * sVar46 |
                         ((short)uVar75 >= sVar46) * uVar75;
                    auVar124._4_2_ =
                         (ushort)((short)uVar77 < sVar48) * sVar48 |
                         ((short)uVar77 >= sVar48) * uVar77;
                    auVar124._6_2_ =
                         (ushort)((short)uVar79 < sVar51) * sVar51 |
                         ((short)uVar79 >= sVar51) * uVar79;
                    auVar124._8_2_ =
                         (ushort)((short)uVar81 < sVar54) * sVar54 |
                         ((short)uVar81 >= sVar54) * uVar81;
                    auVar124._10_2_ =
                         (ushort)((short)uVar83 < sVar57) * sVar57 |
                         ((short)uVar83 >= sVar57) * uVar83;
                    auVar124._12_2_ =
                         (ushort)((short)uVar85 < sVar60) * sVar60 |
                         ((short)uVar85 >= sVar60) * uVar85;
                    auVar124._14_2_ =
                         (ushort)((short)uVar87 < sVar63) * sVar63 |
                         ((short)uVar87 >= sVar63) * uVar87;
                    *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar138;
                    *(undefined1 (*) [16])((long)*b_03 + lVar27) = auVar115;
                    *(undefined1 (*) [16])((long)*b_04 + lVar27) = auVar140;
                    *(undefined1 (*) [16])((long)*b_05 + lVar27) = auVar113;
                    lVar27 = lVar27 + 0x10;
                    auVar109 = auVar72;
                    auVar113 = auVar108;
                    auVar140 = auVar110;
                    auVar141 = auVar112;
                  }
                  auVar135._0_8_ = local_1b8._0_8_ << 0x10;
                  auVar135._8_8_ = local_1b8._8_8_ << 0x10 | (ulong)local_1b8._0_8_ >> 0x30;
                  auVar108._0_8_ = local_1e8._0_8_ << 0x10;
                  auVar108._8_8_ = local_1e8._8_8_ << 0x10 | (ulong)local_1e8._0_8_ >> 0x30;
                  auVar115._8_8_ = auVar124._8_8_ << 0x10 | auVar124._0_8_ >> 0x30;
                  uVar67 = ptr_06[uVar19 + 1];
                  auVar115._0_8_ = auVar124._0_8_ << 0x10 | (ulong)uVar67;
                  in_XMM15._0_8_ = local_178._0_8_ << 0x10;
                  in_XMM15._8_8_ = local_178._8_8_ << 0x10 | (ulong)local_178._0_8_ >> 0x30;
                  uVar19 = uVar19 + 1;
                  auVar72 = paddsw((undefined1  [16])*ptr_04,auVar115);
                  sVar31 = auVar72._0_2_;
                  auVar112._0_2_ = -(ushort)(sVar31 < sVar33);
                  sVar32 = auVar72._2_2_;
                  auVar112._2_2_ = -(ushort)(sVar32 < sVar34);
                  sVar46 = auVar72._4_2_;
                  auVar112._4_2_ = -(ushort)(sVar46 < sVar50);
                  sVar47 = auVar72._6_2_;
                  auVar112._6_2_ = -(ushort)(sVar47 < sVar53);
                  sVar48 = auVar72._8_2_;
                  auVar112._8_2_ = -(ushort)(sVar48 < sVar56);
                  sVar49 = auVar72._10_2_;
                  auVar112._10_2_ = -(ushort)(sVar49 < sVar59);
                  sVar51 = auVar72._12_2_;
                  auVar112._12_2_ = -(ushort)(sVar51 < sVar62);
                  sVar52 = auVar72._14_2_;
                  auVar112._14_2_ = -(ushort)(sVar52 < sVar65);
                  auVar96._0_2_ =
                       (ushort)(sVar31 < sVar33) * sVar33 | (ushort)(sVar31 >= sVar33) * sVar31;
                  auVar96._2_2_ =
                       (ushort)(sVar32 < sVar34) * sVar34 | (ushort)(sVar32 >= sVar34) * sVar32;
                  auVar96._4_2_ =
                       (ushort)(sVar46 < sVar50) * sVar50 | (ushort)(sVar46 >= sVar50) * sVar46;
                  auVar96._6_2_ =
                       (ushort)(sVar47 < sVar53) * sVar53 | (ushort)(sVar47 >= sVar53) * sVar47;
                  auVar96._8_2_ =
                       (ushort)(sVar48 < sVar56) * sVar56 | (ushort)(sVar48 >= sVar56) * sVar48;
                  auVar96._10_2_ =
                       (ushort)(sVar49 < sVar59) * sVar59 | (ushort)(sVar49 >= sVar59) * sVar49;
                  auVar96._12_2_ =
                       (ushort)(sVar51 < sVar62) * sVar62 | (ushort)(sVar51 >= sVar62) * sVar51;
                  auVar96._14_2_ =
                       (ushort)(sVar52 < sVar65) * sVar65 | (ushort)(sVar52 >= sVar65) * sVar52;
                  auVar72 = pblendvb(auVar135,local_188,auVar112);
                  auVar71 = pblendvb(auVar108,local_198,auVar112);
                  auVar110 = paddsw((undefined1  [16])*ptr_05,in_XMM15);
                  auVar68 = pblendvb(auVar110,auVar68,auVar112);
                  iVar24 = 6;
                  while( true ) {
                    auVar138._0_8_ = auVar96._0_8_ << 0x10;
                    auVar138._8_8_ = auVar96._8_8_ << 0x10 | auVar96._0_8_ >> 0x30;
                    auVar136._0_8_ = auVar72._0_8_ << 0x10;
                    auVar136._8_8_ = auVar72._8_8_ << 0x10 | auVar72._0_8_ >> 0x30;
                    auVar137._0_8_ = auVar71._0_8_ << 0x10;
                    auVar137._8_8_ = auVar71._8_8_ << 0x10 | auVar71._0_8_ >> 0x30;
                    auVar139._0_8_ = auVar68._0_8_ << 0x10;
                    auVar139._8_8_ = auVar68._8_8_ << 0x10 | auVar68._0_8_ >> 0x30;
                    bVar30 = iVar24 == 0;
                    iVar24 = iVar24 + -1;
                    if (bVar30) break;
                    auVar110 = paddsw(auVar138,auVar89);
                    sVar33 = auVar96._0_2_;
                    sVar31 = auVar110._0_2_;
                    auVar43._0_2_ = -(ushort)(sVar31 < sVar33);
                    sVar34 = auVar96._2_2_;
                    sVar32 = auVar110._2_2_;
                    auVar43._2_2_ = -(ushort)(sVar32 < sVar34);
                    sVar50 = auVar96._4_2_;
                    sVar46 = auVar110._4_2_;
                    auVar43._4_2_ = -(ushort)(sVar46 < sVar50);
                    sVar53 = auVar96._6_2_;
                    sVar47 = auVar110._6_2_;
                    auVar43._6_2_ = -(ushort)(sVar47 < sVar53);
                    sVar56 = auVar96._8_2_;
                    sVar48 = auVar110._8_2_;
                    auVar43._8_2_ = -(ushort)(sVar48 < sVar56);
                    sVar59 = auVar96._10_2_;
                    sVar49 = auVar110._10_2_;
                    auVar43._10_2_ = -(ushort)(sVar49 < sVar59);
                    sVar62 = auVar96._12_2_;
                    sVar51 = auVar110._12_2_;
                    sVar65 = auVar96._14_2_;
                    auVar43._12_2_ = -(ushort)(sVar51 < sVar62);
                    sVar52 = auVar110._14_2_;
                    auVar43._14_2_ = -(ushort)(sVar52 < sVar65);
                    auVar72 = pblendvb(auVar136,auVar72,auVar43);
                    auVar71 = pblendvb(auVar137,auVar71,auVar43);
                    auVar110 = paddsw(auVar139,auVar69);
                    auVar68 = pblendvb(auVar110,auVar68,auVar43);
                    auVar96._0_2_ =
                         (ushort)(sVar33 < sVar31) * sVar31 | (ushort)(sVar33 >= sVar31) * sVar33;
                    auVar96._2_2_ =
                         (ushort)(sVar34 < sVar32) * sVar32 | (ushort)(sVar34 >= sVar32) * sVar34;
                    auVar96._4_2_ =
                         (ushort)(sVar50 < sVar46) * sVar46 | (ushort)(sVar50 >= sVar46) * sVar50;
                    auVar96._6_2_ =
                         (ushort)(sVar53 < sVar47) * sVar47 | (ushort)(sVar53 >= sVar47) * sVar53;
                    auVar96._8_2_ =
                         (ushort)(sVar56 < sVar48) * sVar48 | (ushort)(sVar56 >= sVar48) * sVar56;
                    auVar96._10_2_ =
                         (ushort)(sVar59 < sVar49) * sVar49 | (ushort)(sVar59 >= sVar49) * sVar59;
                    auVar96._12_2_ =
                         (ushort)(sVar62 < sVar51) * sVar51 | (ushort)(sVar62 >= sVar51) * sVar62;
                    auVar96._14_2_ =
                         (ushort)(sVar65 < sVar52) * sVar52 | (ushort)(sVar65 >= sVar52) * sVar65;
                  }
                  auVar97 = paddsw(auVar138,ZEXT416(uVar15 & 0xffff));
                  sVar33 = auVar97._0_2_;
                  auVar44._0_2_ = -(ushort)((short)uVar67 < sVar33);
                  sVar34 = auVar97._2_2_;
                  sVar31 = auVar124._0_2_;
                  auVar44._2_2_ = -(ushort)(sVar31 < sVar34);
                  sVar50 = auVar97._4_2_;
                  sVar32 = auVar124._2_2_;
                  auVar44._4_2_ = -(ushort)(sVar32 < sVar50);
                  sVar53 = auVar97._6_2_;
                  sVar46 = auVar124._4_2_;
                  auVar44._6_2_ = -(ushort)(sVar46 < sVar53);
                  sVar56 = auVar97._8_2_;
                  sVar47 = auVar124._6_2_;
                  auVar44._8_2_ = -(ushort)(sVar47 < sVar56);
                  sVar59 = auVar97._10_2_;
                  sVar48 = auVar124._8_2_;
                  auVar44._10_2_ = -(ushort)(sVar48 < sVar59);
                  sVar62 = auVar97._12_2_;
                  sVar49 = auVar124._10_2_;
                  sVar65 = auVar97._14_2_;
                  auVar44._12_2_ = -(ushort)(sVar49 < sVar62);
                  sVar51 = auVar124._12_2_;
                  auVar44._14_2_ = -(ushort)(sVar51 < sVar65);
                  auVar125._0_2_ =
                       (ushort)((short)uVar67 < sVar33) * sVar33 |
                       ((short)uVar67 >= sVar33) * uVar67;
                  auVar125._2_2_ =
                       (ushort)(sVar31 < sVar34) * sVar34 | (ushort)(sVar31 >= sVar34) * sVar31;
                  auVar125._4_2_ =
                       (ushort)(sVar32 < sVar50) * sVar50 | (ushort)(sVar32 >= sVar50) * sVar32;
                  auVar125._6_2_ =
                       (ushort)(sVar46 < sVar53) * sVar53 | (ushort)(sVar46 >= sVar53) * sVar46;
                  auVar125._8_2_ =
                       (ushort)(sVar47 < sVar56) * sVar56 | (ushort)(sVar47 >= sVar56) * sVar47;
                  auVar125._10_2_ =
                       (ushort)(sVar48 < sVar59) * sVar59 | (ushort)(sVar48 >= sVar59) * sVar48;
                  auVar125._12_2_ =
                       (ushort)(sVar49 < sVar62) * sVar62 | (ushort)(sVar49 >= sVar62) * sVar49;
                  auVar125._14_2_ =
                       (ushort)(sVar51 < sVar65) * sVar65 | (ushort)(sVar51 >= sVar65) * sVar51;
                  auVar110 = pblendvb(auVar135,auVar136,auVar44);
                  auVar72 = pblendvb(auVar108,auVar137,auVar44);
                  auVar68 = pblendvb(in_XMM15,auVar139,auVar44);
                  for (lVar27 = 0; local_1b8 = auVar135, size << 4 != lVar27; lVar27 = lVar27 + 0x10
                      ) {
                    auVar12._4_4_ = uVar35;
                    auVar12._0_4_ = uVar35;
                    auVar12._8_4_ = uVar35;
                    auVar12._12_4_ = uVar35;
                    auVar109 = psubsw(auVar125,auVar12);
                    auVar10._4_4_ = uVar36;
                    auVar10._0_4_ = uVar36;
                    auVar10._8_4_ = uVar36;
                    auVar10._12_4_ = uVar36;
                    auVar71 = psubsw(auVar97,auVar10);
                    sVar33 = auVar71._0_2_;
                    sVar31 = auVar109._0_2_;
                    auVar126._0_2_ = -(ushort)(sVar33 < sVar31);
                    sVar34 = auVar71._2_2_;
                    sVar32 = auVar109._2_2_;
                    auVar126._2_2_ = -(ushort)(sVar34 < sVar32);
                    sVar50 = auVar71._4_2_;
                    sVar46 = auVar109._4_2_;
                    auVar126._4_2_ = -(ushort)(sVar50 < sVar46);
                    sVar53 = auVar71._6_2_;
                    sVar47 = auVar109._6_2_;
                    auVar126._6_2_ = -(ushort)(sVar53 < sVar47);
                    sVar56 = auVar71._8_2_;
                    sVar48 = auVar109._8_2_;
                    auVar126._8_2_ = -(ushort)(sVar56 < sVar48);
                    sVar59 = auVar71._10_2_;
                    sVar49 = auVar109._10_2_;
                    auVar126._10_2_ = -(ushort)(sVar59 < sVar49);
                    sVar62 = auVar71._12_2_;
                    sVar51 = auVar109._12_2_;
                    sVar52 = auVar109._14_2_;
                    auVar126._12_2_ = -(ushort)(sVar62 < sVar51);
                    sVar65 = auVar71._14_2_;
                    auVar126._14_2_ = -(ushort)(sVar65 < sVar52);
                    auVar136 = pblendvb(auVar136,auVar110,auVar126);
                    auVar137 = pblendvb(auVar137,auVar72,auVar126);
                    puVar1 = (ushort *)((long)*ptr + lVar27);
                    uVar67 = *puVar1;
                    uVar75 = puVar1[1];
                    uVar77 = puVar1[2];
                    uVar79 = puVar1[3];
                    uVar81 = puVar1[4];
                    uVar83 = puVar1[5];
                    uVar85 = puVar1[6];
                    uVar87 = puVar1[7];
                    auVar68 = pblendvb(auVar139,auVar68,auVar126);
                    auVar97._0_2_ =
                         (ushort)(sVar31 < sVar33) * sVar33 | (ushort)(sVar31 >= sVar33) * sVar31;
                    auVar97._2_2_ =
                         (ushort)(sVar32 < sVar34) * sVar34 | (ushort)(sVar32 >= sVar34) * sVar32;
                    auVar97._4_2_ =
                         (ushort)(sVar46 < sVar50) * sVar50 | (ushort)(sVar46 >= sVar50) * sVar46;
                    auVar97._6_2_ =
                         (ushort)(sVar47 < sVar53) * sVar53 | (ushort)(sVar47 >= sVar53) * sVar47;
                    auVar97._8_2_ =
                         (ushort)(sVar48 < sVar56) * sVar56 | (ushort)(sVar48 >= sVar56) * sVar48;
                    auVar97._10_2_ =
                         (ushort)(sVar49 < sVar59) * sVar59 | (ushort)(sVar49 >= sVar59) * sVar49;
                    auVar97._12_2_ =
                         (ushort)(sVar51 < sVar62) * sVar62 | (ushort)(sVar51 >= sVar62) * sVar51;
                    auVar97._14_2_ =
                         (ushort)(sVar52 < sVar65) * sVar65 | (ushort)(sVar52 >= sVar65) * sVar52;
                    psVar2 = (short *)((long)*b + lVar27);
                    sVar33 = *psVar2;
                    sVar34 = psVar2[1];
                    sVar50 = psVar2[2];
                    sVar53 = psVar2[3];
                    sVar56 = psVar2[4];
                    sVar59 = psVar2[5];
                    sVar62 = psVar2[6];
                    sVar65 = psVar2[7];
                    uVar94 = (sVar33 < (short)uVar67) * uVar67 |
                             (ushort)(sVar33 >= (short)uVar67) * sVar33;
                    uVar100 = (sVar34 < (short)uVar75) * uVar75 |
                              (ushort)(sVar34 >= (short)uVar75) * sVar34;
                    uVar101 = (sVar50 < (short)uVar77) * uVar77 |
                              (ushort)(sVar50 >= (short)uVar77) * sVar50;
                    uVar102 = (sVar53 < (short)uVar79) * uVar79 |
                              (ushort)(sVar53 >= (short)uVar79) * sVar53;
                    uVar103 = (sVar56 < (short)uVar81) * uVar81 |
                              (ushort)(sVar56 >= (short)uVar81) * sVar56;
                    uVar105 = (sVar59 < (short)uVar83) * uVar83 |
                              (ushort)(sVar59 >= (short)uVar83) * sVar59;
                    uVar106 = (sVar62 < (short)uVar85) * uVar85 |
                              (ushort)(sVar62 >= (short)uVar85) * sVar62;
                    uVar107 = (sVar65 < (short)uVar87) * uVar87 |
                              (ushort)(sVar65 >= (short)uVar87) * sVar65;
                    auVar125._0_2_ =
                         ((short)uVar94 < (short)auVar97._0_2_) * auVar97._0_2_ |
                         ((short)uVar94 >= (short)auVar97._0_2_) * uVar94;
                    auVar125._2_2_ =
                         ((short)uVar100 < (short)auVar97._2_2_) * auVar97._2_2_ |
                         ((short)uVar100 >= (short)auVar97._2_2_) * uVar100;
                    auVar125._4_2_ =
                         ((short)uVar101 < (short)auVar97._4_2_) * auVar97._4_2_ |
                         ((short)uVar101 >= (short)auVar97._4_2_) * uVar101;
                    auVar125._6_2_ =
                         ((short)uVar102 < (short)auVar97._6_2_) * auVar97._6_2_ |
                         ((short)uVar102 >= (short)auVar97._6_2_) * uVar102;
                    auVar125._8_2_ =
                         ((short)uVar103 < (short)auVar97._8_2_) * auVar97._8_2_ |
                         ((short)uVar103 >= (short)auVar97._8_2_) * uVar103;
                    auVar125._10_2_ =
                         ((short)uVar105 < (short)auVar97._10_2_) * auVar97._10_2_ |
                         ((short)uVar105 >= (short)auVar97._10_2_) * uVar105;
                    auVar125._12_2_ =
                         ((short)uVar106 < (short)auVar97._12_2_) * auVar97._12_2_ |
                         ((short)uVar106 >= (short)auVar97._12_2_) * uVar106;
                    auVar125._14_2_ =
                         ((short)uVar107 < (short)auVar97._14_2_) * auVar97._14_2_ |
                         ((short)uVar107 >= (short)auVar97._14_2_) * uVar107;
                    auVar91._0_2_ = -(ushort)(uVar67 == auVar125._0_2_);
                    auVar91._2_2_ = -(ushort)(uVar75 == auVar125._2_2_);
                    auVar91._4_2_ = -(ushort)(uVar77 == auVar125._4_2_);
                    auVar91._6_2_ = -(ushort)(uVar79 == auVar125._6_2_);
                    auVar91._8_2_ = -(ushort)(uVar81 == auVar125._8_2_);
                    auVar91._10_2_ = -(ushort)(uVar83 == auVar125._10_2_);
                    auVar91._12_2_ = -(ushort)(uVar85 == auVar125._12_2_);
                    auVar91._14_2_ = -(ushort)(uVar87 == auVar125._14_2_);
                    auVar98._0_2_ = -(ushort)((short)auVar97._0_2_ < (short)uVar94);
                    auVar98._2_2_ = -(ushort)((short)auVar97._2_2_ < (short)uVar100);
                    auVar98._4_2_ = -(ushort)((short)auVar97._4_2_ < (short)uVar101);
                    auVar98._6_2_ = -(ushort)((short)auVar97._6_2_ < (short)uVar102);
                    auVar98._8_2_ = -(ushort)((short)auVar97._8_2_ < (short)uVar103);
                    auVar98._10_2_ = -(ushort)((short)auVar97._10_2_ < (short)uVar105);
                    auVar98._12_2_ = -(ushort)((short)auVar97._12_2_ < (short)uVar106);
                    auVar98._14_2_ = -(ushort)((short)auVar97._14_2_ < (short)uVar107);
                    auVar72 = pblendvb(auVar136,*(undefined1 (*) [16])((long)*b_00 + lVar27),auVar98
                                      );
                    auVar110 = pblendvb(auVar72,*(undefined1 (*) [16])((long)*b_03 + lVar27),auVar91
                                       );
                    auVar139 = paddsw(auVar68,_DAT_008a1ba0);
                    auVar68 = pblendvb(auVar137,*(undefined1 (*) [16])((long)*b_01 + lVar27),auVar98
                                      );
                    auVar72 = pblendvb(auVar68,*(undefined1 (*) [16])((long)*b_04 + lVar27),auVar91)
                    ;
                    auVar68 = pblendvb(auVar139,*(undefined1 (*) [16])((long)*b_02 + lVar27),auVar98
                                      );
                    auVar68 = pblendvb(auVar68,*(undefined1 (*) [16])((long)*b_05 + lVar27),auVar91)
                    ;
                    *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar125;
                    *(undefined1 (*) [16])((long)*b_03 + lVar27) = auVar110;
                    *(undefined1 (*) [16])((long)*b_04 + lVar27) = auVar72;
                    *(undefined1 (*) [16])((long)*b_05 + lVar27) = auVar68;
                    uVar127 = ((short)auVar125._0_2_ < (short)uVar127) * auVar125._0_2_ |
                              ((short)auVar125._0_2_ >= (short)uVar127) * uVar127;
                    uVar128 = ((short)auVar125._2_2_ < (short)uVar128) * auVar125._2_2_ |
                              ((short)auVar125._2_2_ >= (short)uVar128) * uVar128;
                    uVar129 = ((short)auVar125._4_2_ < (short)uVar129) * auVar125._4_2_ |
                              ((short)auVar125._4_2_ >= (short)uVar129) * uVar129;
                    uVar130 = ((short)auVar125._6_2_ < (short)uVar130) * auVar125._6_2_ |
                              ((short)auVar125._6_2_ >= (short)uVar130) * uVar130;
                    uVar131 = ((short)auVar125._8_2_ < (short)uVar131) * auVar125._8_2_ |
                              ((short)auVar125._8_2_ >= (short)uVar131) * uVar131;
                    uVar132 = ((short)auVar125._10_2_ < (short)uVar132) * auVar125._10_2_ |
                              ((short)auVar125._10_2_ >= (short)uVar132) * uVar132;
                    uVar133 = ((short)auVar125._12_2_ < (short)uVar133) * auVar125._12_2_ |
                              ((short)auVar125._12_2_ >= (short)uVar133) * uVar133;
                    uVar134 = ((short)auVar125._14_2_ < (short)uVar134) * auVar125._14_2_ |
                              ((short)auVar125._14_2_ >= (short)uVar134) * uVar134;
                    uVar114 = ((short)uVar114 < (short)auVar125._0_2_) * auVar125._0_2_ |
                              ((short)uVar114 >= (short)auVar125._0_2_) * uVar114;
                    uVar117 = ((short)uVar117 < (short)auVar125._2_2_) * auVar125._2_2_ |
                              ((short)uVar117 >= (short)auVar125._2_2_) * uVar117;
                    uVar118 = ((short)uVar118 < (short)auVar125._4_2_) * auVar125._4_2_ |
                              ((short)uVar118 >= (short)auVar125._4_2_) * uVar118;
                    uVar119 = ((short)uVar119 < (short)auVar125._6_2_) * auVar125._6_2_ |
                              ((short)uVar119 >= (short)auVar125._6_2_) * uVar119;
                    uVar120 = ((short)uVar120 < (short)auVar125._8_2_) * auVar125._8_2_ |
                              ((short)uVar120 >= (short)auVar125._8_2_) * uVar120;
                    uVar121 = ((short)uVar121 < (short)auVar125._10_2_) * auVar125._10_2_ |
                              ((short)uVar121 >= (short)auVar125._10_2_) * uVar121;
                    uVar122 = ((short)uVar122 < (short)auVar125._12_2_) * auVar125._12_2_ |
                              ((short)uVar122 >= (short)auVar125._12_2_) * uVar122;
                    uVar123 = ((short)uVar123 < (short)auVar125._14_2_) * auVar125._14_2_ |
                              ((short)uVar123 >= (short)auVar125._14_2_) * uVar123;
                    sVar33 = auVar110._0_2_;
                    uVar67 = (ushort)((short)uVar114 < sVar33) * sVar33 |
                             ((short)uVar114 >= sVar33) * uVar114;
                    sVar33 = auVar110._2_2_;
                    uVar75 = (ushort)((short)uVar117 < sVar33) * sVar33 |
                             ((short)uVar117 >= sVar33) * uVar117;
                    sVar33 = auVar110._4_2_;
                    uVar77 = (ushort)((short)uVar118 < sVar33) * sVar33 |
                             ((short)uVar118 >= sVar33) * uVar118;
                    sVar33 = auVar110._6_2_;
                    uVar79 = (ushort)((short)uVar119 < sVar33) * sVar33 |
                             ((short)uVar119 >= sVar33) * uVar119;
                    sVar33 = auVar110._8_2_;
                    uVar81 = (ushort)((short)uVar120 < sVar33) * sVar33 |
                             ((short)uVar120 >= sVar33) * uVar120;
                    sVar33 = auVar110._10_2_;
                    uVar83 = (ushort)((short)uVar121 < sVar33) * sVar33 |
                             ((short)uVar121 >= sVar33) * uVar121;
                    sVar33 = auVar110._12_2_;
                    uVar85 = (ushort)((short)uVar122 < sVar33) * sVar33 |
                             ((short)uVar122 >= sVar33) * uVar122;
                    sVar33 = auVar110._14_2_;
                    uVar87 = (ushort)((short)uVar123 < sVar33) * sVar33 |
                             ((short)uVar123 >= sVar33) * uVar123;
                    sVar33 = auVar68._0_2_;
                    sVar34 = auVar72._0_2_;
                    uVar114 = (ushort)(sVar34 < sVar33) * sVar33 |
                              (ushort)(sVar34 >= sVar33) * sVar34;
                    sVar33 = auVar68._2_2_;
                    sVar34 = auVar72._2_2_;
                    uVar117 = (ushort)(sVar34 < sVar33) * sVar33 |
                              (ushort)(sVar34 >= sVar33) * sVar34;
                    sVar33 = auVar68._4_2_;
                    sVar34 = auVar72._4_2_;
                    uVar118 = (ushort)(sVar34 < sVar33) * sVar33 |
                              (ushort)(sVar34 >= sVar33) * sVar34;
                    sVar33 = auVar68._6_2_;
                    sVar34 = auVar72._6_2_;
                    uVar119 = (ushort)(sVar34 < sVar33) * sVar33 |
                              (ushort)(sVar34 >= sVar33) * sVar34;
                    sVar33 = auVar68._8_2_;
                    sVar34 = auVar72._8_2_;
                    uVar120 = (ushort)(sVar34 < sVar33) * sVar33 |
                              (ushort)(sVar34 >= sVar33) * sVar34;
                    sVar33 = auVar68._10_2_;
                    sVar34 = auVar72._10_2_;
                    uVar121 = (ushort)(sVar34 < sVar33) * sVar33 |
                              (ushort)(sVar34 >= sVar33) * sVar34;
                    sVar33 = auVar68._12_2_;
                    sVar34 = auVar72._12_2_;
                    sVar50 = auVar72._14_2_;
                    uVar122 = (ushort)(sVar34 < sVar33) * sVar33 |
                              (ushort)(sVar34 >= sVar33) * sVar34;
                    sVar33 = auVar68._14_2_;
                    uVar123 = (ushort)(sVar50 < sVar33) * sVar33 |
                              (ushort)(sVar50 >= sVar33) * sVar50;
                    uVar114 = ((short)uVar67 < (short)uVar114) * uVar114 |
                              ((short)uVar67 >= (short)uVar114) * uVar67;
                    uVar117 = ((short)uVar75 < (short)uVar117) * uVar117 |
                              ((short)uVar75 >= (short)uVar117) * uVar75;
                    uVar118 = ((short)uVar77 < (short)uVar118) * uVar118 |
                              ((short)uVar77 >= (short)uVar118) * uVar77;
                    uVar119 = ((short)uVar79 < (short)uVar119) * uVar119 |
                              ((short)uVar79 >= (short)uVar119) * uVar79;
                    uVar120 = ((short)uVar81 < (short)uVar120) * uVar120 |
                              ((short)uVar81 >= (short)uVar120) * uVar81;
                    uVar121 = ((short)uVar83 < (short)uVar121) * uVar121 |
                              ((short)uVar83 >= (short)uVar121) * uVar83;
                    uVar122 = ((short)uVar85 < (short)uVar122) * uVar122 |
                              ((short)uVar85 >= (short)uVar122) * uVar85;
                    uVar123 = ((short)uVar87 < (short)uVar123) * uVar123 |
                              ((short)uVar87 >= (short)uVar123) * uVar87;
                  }
                }
                alVar99 = ptr[uVar37];
                alVar92 = b_03[uVar37];
                alVar73 = b_04[uVar37];
                alVar45 = b_05[uVar37];
                iVar24 = 0;
                while( true ) {
                  uVar95 = alVar99[0];
                  lVar104 = alVar99[1];
                  uVar88 = alVar92[0];
                  lVar93 = alVar92[1];
                  uVar19 = alVar73[0];
                  lVar29 = alVar73[1];
                  uVar37 = alVar45[0];
                  lVar27 = alVar45[1];
                  if (7 - (int)(uVar25 / size) <= iVar24) break;
                  alVar99[0] = uVar95 << 0x10;
                  alVar99[1] = lVar104 << 0x10 | uVar95 >> 0x30;
                  alVar92[0] = uVar88 << 0x10;
                  alVar92[1] = lVar93 << 0x10 | uVar88 >> 0x30;
                  alVar73[0] = uVar19 << 0x10;
                  alVar73[1] = lVar29 << 0x10 | uVar19 >> 0x30;
                  alVar45[0] = uVar37 << 0x10;
                  alVar45[1] = lVar27 << 0x10 | uVar37 >> 0x30;
                  iVar24 = iVar24 + 1;
                }
                auVar111._0_2_ = -(ushort)((short)uVar127 < (short)local_128);
                auVar111._2_2_ = -(ushort)((short)uVar128 < (short)uStack_126);
                auVar111._4_2_ = -(ushort)((short)uVar129 < (short)local_128);
                auVar111._6_2_ = -(ushort)((short)uVar130 < (short)uStack_126);
                auVar111._8_2_ = -(ushort)((short)uVar131 < (short)local_128);
                auVar111._10_2_ = -(ushort)((short)uVar132 < (short)uStack_126);
                auVar111._12_2_ = -(ushort)((short)uVar133 < (short)local_128);
                auVar111._14_2_ = -(ushort)((short)uVar134 < (short)uStack_126);
                auVar116._0_2_ = -(ushort)((short)local_a8 < (short)uVar114);
                auVar116._2_2_ = -(ushort)((short)uStack_a6 < (short)uVar117);
                auVar116._4_2_ = -(ushort)((short)local_a8 < (short)uVar118);
                auVar116._6_2_ = -(ushort)((short)uStack_a6 < (short)uVar119);
                auVar116._8_2_ = -(ushort)((short)local_a8 < (short)uVar120);
                auVar116._10_2_ = -(ushort)((short)uStack_a6 < (short)uVar121);
                auVar116._12_2_ = -(ushort)((short)local_a8 < (short)uVar122);
                auVar116._14_2_ = -(ushort)((short)uStack_a6 < (short)uVar123);
                auVar116 = auVar116 | auVar111;
                if ((((((((((((((((auVar116 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar116 >> 0xf & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar116 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar116 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                              (auVar116 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar116 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar116 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar116 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                          && (auVar116 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar116 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar116 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar116 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar116 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar116 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar116 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar116[0xf]) {
                  sVar33 = alVar99[1]._6_2_;
                  sVar34 = alVar92[1]._6_2_;
                  sVar50 = alVar73[1]._6_2_;
                  sVar53 = alVar45[1]._6_2_;
                }
                else {
                  *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                  sVar33 = 0;
                  sVar34 = 0;
                  sVar50 = 0;
                  sVar53 = 0;
                  iVar14 = 0;
                  uVar25 = 0;
                }
                ppVar17->score = (int)sVar33;
                ppVar17->end_query = uVar25;
                ppVar17->end_ref = iVar14;
                *(int *)(ppVar17->field_4).extra = (int)sVar34;
                ((ppVar17->field_4).stats)->similar = (int)sVar50;
                ((ppVar17->field_4).stats)->length = (int)sVar53;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar17;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_scan_profile_sse41_128_16",pcVar20);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}